

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O0

ssize_t __thiscall Connection::send(Connection *this,int __fd,void *__buf,size_t __n,int __flags)

{
  bool bVar1;
  byte bVar2;
  uint32_t size_00;
  element_type *peVar3;
  Connection *extraout_RAX;
  undefined4 extraout_var;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  ssize_t sVar8;
  Connection *extraout_RAX_00;
  SocketClientBuffer *this_00;
  Connection *extraout_RAX_01;
  size_t __n_00;
  undefined7 uVar9;
  void *__buf_00;
  void *__buf_01;
  undefined4 in_register_00000034;
  byte local_10c;
  byte local_10a;
  unique_ptr<SocketClientBuffer,_std::default_delete<SocketClientBuffer>_> local_b0;
  unique_ptr<Serializer::Buffer,_std::default_delete<Serializer::Buffer>_> local_a8;
  undefined1 local_a0 [8];
  Serializer serializer;
  String value;
  String header;
  size_t size;
  Message *local_38;
  enable_shared_from_this<Connection> local_30;
  Message *local_20;
  Message *message_local;
  Connection *this_local;
  size_t sVar4;
  
  local_20 = (Message *)CONCAT44(in_register_00000034,__fd);
  message_local = (Message *)this;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->mSocketClient);
  if (bVar1) {
    peVar3 = std::__shared_ptr_access<SocketClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<SocketClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mSocketClient);
    bVar1 = SocketClient::isConnected(peVar3);
    if (bVar1) {
      std::enable_shared_from_this<Connection>::shared_from_this(&local_30);
      local_38 = local_20;
      Signal<std::function<void(std::shared_ptr<Connection>,Message_const*)>>::operator()
                (&this->mAboutToSend,(shared_ptr<Connection> *)&local_30,&local_38);
      std::shared_ptr<Connection>::~shared_ptr((shared_ptr<Connection> *)&local_30);
      size_00 = (*local_20->_vptr_Message[4])();
      sVar4 = CONCAT44(extraout_var,size_00);
      if ((sVar4 == 0xffffffffffffffff) || ((local_20->mFlags & 2) != 0)) {
        String::String((String *)((long)&value.mString.field_2 + 8),(char *)0x0,0xffffffffffffffff);
        String::String((String *)&serializer.mBuffer,(char *)0x0,0xffffffffffffffff);
        Message::prepare(local_20,this->mVersion,(String *)((long)&value.mString.field_2 + 8),
                         (String *)&serializer.mBuffer);
        sVar5 = String::size((String *)((long)&value.mString.field_2 + 8));
        sVar6 = String::size((String *)&serializer.mBuffer);
        __n_00 = (long)this->mPendingWrite + sVar5 + sVar6;
        this->mPendingWrite = (int)__n_00;
        bVar1 = true;
        if (sVar4 != 0xffffffffffffffff) {
          sVar5 = String::size((String *)((long)&value.mString.field_2 + 8));
          sVar6 = String::size((String *)&serializer.mBuffer);
          __n_00 = (sVar5 + sVar6) - 4;
          bVar1 = sVar4 == __n_00;
        }
        if (!bVar1) {
          __assert_fail("size == String::npos || size == (header.size() + value.size() - 4)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Connection.cpp"
                        ,0xde,"bool Connection::send(const Message &)");
        }
        peVar3 = std::__shared_ptr_access<SocketClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<SocketClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->mSocketClient);
        uVar7 = SocketClient::write(peVar3,(int)&value + 0x18,__buf_00,__n_00);
        uVar9 = (undefined7)(__n_00 >> 8);
        local_10a = 0;
        if ((uVar7 & 1) != 0) {
          bVar1 = String::isEmpty((String *)&serializer.mBuffer);
          sVar4 = CONCAT71(uVar9,bVar1);
          local_10c = 1;
          if (!bVar1) {
            peVar3 = std::
                     __shared_ptr_access<SocketClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<SocketClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&this->mSocketClient);
            sVar8 = SocketClient::write(peVar3,(int)&serializer + 8,__buf_01,sVar4);
            local_10c = (byte)sVar8;
          }
          local_10a = local_10c;
        }
        this_local._7_1_ = local_10a & 1;
        String::~String((String *)&serializer.mBuffer);
        String::~String((String *)((long)&value.mString.field_2 + 8));
        this = extraout_RAX_00;
      }
      else {
        this->mPendingWrite = size_00 + 10 + this->mPendingWrite;
        this_00 = (SocketClientBuffer *)operator_new(0x20);
        SocketClientBuffer::SocketClientBuffer(this_00,&this->mSocketClient);
        std::unique_ptr<SocketClientBuffer,std::default_delete<SocketClientBuffer>>::
        unique_ptr<std::default_delete<SocketClientBuffer>,void>
                  ((unique_ptr<SocketClientBuffer,std::default_delete<SocketClientBuffer>> *)
                   &local_b0,this_00);
        std::unique_ptr<Serializer::Buffer,std::default_delete<Serializer::Buffer>>::
        unique_ptr<SocketClientBuffer,std::default_delete<SocketClientBuffer>,void>
                  ((unique_ptr<Serializer::Buffer,std::default_delete<Serializer::Buffer>> *)
                   &local_a8,&local_b0);
        Serializer::Serializer((Serializer *)local_a0,&local_a8);
        std::unique_ptr<Serializer::Buffer,_std::default_delete<Serializer::Buffer>_>::~unique_ptr
                  (&local_a8);
        std::unique_ptr<SocketClientBuffer,_std::default_delete<SocketClientBuffer>_>::~unique_ptr
                  (&local_b0);
        Message::encodeHeader(local_20,(Serializer *)local_a0,size_00,this->mVersion);
        (*local_20->_vptr_Message[2])(local_20,local_a0);
        bVar1 = Serializer::hasError((Serializer *)local_a0);
        this_local._7_1_ = (bVar1 ^ 0xffU) & 1;
        Serializer::~Serializer((Serializer *)local_a0);
        this = extraout_RAX_01;
      }
      goto LAB_00225219;
    }
  }
  if ((this->mWarned & 1U) == 0) {
    this->mWarned = true;
    bVar2 = Message::messageId(local_20);
    warning("Trying to send message to unconnected client (%d)",(ulong)bVar2);
    this = extraout_RAX;
  }
  this_local._7_1_ = 0;
LAB_00225219:
  return CONCAT71((int7)((ulong)this >> 8),this_local._7_1_) & 0xffffffffffffff01;
}

Assistant:

bool Connection::send(const Message &message)
{
    // ::error() << getpid() << "sending message" << static_cast<int>(message.messageId());
    if (!mSocketClient || !mSocketClient->isConnected()) {
        if (!mWarned) {
            mWarned = true;
            warning("Trying to send message to unconnected client (%d)", message.messageId());
        }
        return false;
    }

    mAboutToSend(shared_from_this(), &message);

#ifdef RCT_SERIALIZER_VERIFY_PRIMITIVE_SIZE
    const size_t size = String::npos;
#else
    const size_t size = message.encodedSize();
#endif

    if (size == String::npos || message.mFlags & Message::MessageCache) {
        String header, value;
        message.prepare(mVersion, header, value);
        mPendingWrite += header.size() + value.size();
        assert(size == String::npos || size == (header.size() + value.size() - 4));
        return (mSocketClient->write(header) && (value.isEmpty() || mSocketClient->write(value)));
    } else {
        mPendingWrite += (size + Message::HeaderExtra) + sizeof(int);
        Serializer serializer(std::unique_ptr<SocketClientBuffer>(new SocketClientBuffer(mSocketClient)));
        message.encodeHeader(serializer, size, mVersion);
        message.encode(serializer);
        return !serializer.hasError();
    }
}